

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this,
          TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *gel)

{
  long lVar1;
  int64_t *piVar2;
  int64_t *piVar3;
  byte bVar4;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  bVar4 = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018cc058;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018cbcb0,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018cb9b0;
  (this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018cad10;
  piVar2 = (gel->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes;
  piVar3 = (this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes;
  for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
    *piVar3 = *piVar2;
    piVar2 = piVar2 + (ulong)bVar4 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  (this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticPrism_018cac88;
  lVar1 = 0xd0;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2c8);
  lVar1 = 0xc0;
  do {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes +
               lVar1 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               ((long)(gel->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes +
               lVar1 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2b8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}